

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::internal::TracingTLS::~TracingTLS(TracingTLS *this)

{
  long *plVar1;
  _Head_base<0UL,_void_*,_false> *p_Var2;
  long lVar3;
  long lVar4;
  
  (this->super_ThreadLocalObject)._vptr_PlatformThreadLocalObject =
       (_func_int **)&PTR__TracingTLS_003a2ae8;
  this->is_in_trace_point = true;
  lVar3 = 0;
  do {
    if (*(long *)((long)&(this->track_event_tls).per_instance._M_elems[7].data_source_custom_tls.
                         _M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3 + 8) != 0)
    {
      (**(code **)((long)&(this->track_event_tls).per_instance._M_elems[7].data_source_custom_tls.
                          _M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3))();
    }
    *(undefined8 *)
     ((long)&(this->track_event_tls).per_instance._M_elems[7].data_source_custom_tls._M_t.
             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3 + 8) = 0;
    if (*(long *)((long)&(this->track_event_tls).per_instance._M_elems[7].incremental_state._M_t.
                         super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3 + 8) != 0) {
      (**(code **)((long)&(this->track_event_tls).per_instance._M_elems[7].incremental_state._M_t.
                          super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3))();
    }
    *(undefined8 *)
     ((long)&(this->track_event_tls).per_instance._M_elems[7].incremental_state._M_t.
             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t + lVar3 + 8) = 0;
    plVar1 = *(long **)((long)&(this->track_event_tls).per_instance._M_elems[7].trace_writer._M_t.
                               super___uniq_ptr_impl<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>
                               ._M_t + lVar3);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(undefined8 *)
     ((long)&(this->track_event_tls).per_instance._M_elems[7].trace_writer._M_t.
             super___uniq_ptr_impl<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>
             ._M_t + lVar3) = 0;
    lVar3 = lVar3 + -0x50;
  } while (lVar3 != -0x280);
  p_Var2 = (_Head_base<0UL,_void_*,_false> *)
           ((long)&(this->data_sources_tls)._M_elems[0x1f].per_instance._M_elems[7].
                   data_source_custom_tls._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)> + 8);
  lVar3 = 0x5210;
  do {
    lVar3 = lVar3 + -0x290;
    lVar4 = 0;
    do {
      if (*(long *)((long)&p_Var2->_M_head_impl + lVar4) != 0) {
        (**(code **)((long)&(((_Tuple_impl<0UL,_void_*,_void_(*)(void_*)> *)(p_Var2 + -1))->
                            super__Tuple_impl<1UL,_void_(*)(void_*)>).
                            super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + lVar4))();
      }
      *(undefined8 *)((long)&p_Var2->_M_head_impl + lVar4) = 0;
      if (*(long *)((long)(p_Var2 + -2) + lVar4) != 0) {
        (**(code **)((long)(p_Var2 + -3) + lVar4))();
      }
      *(undefined8 *)((long)(p_Var2 + -2) + lVar4) = 0;
      if (*(long **)((long)(p_Var2 + -4) + lVar4) != (long *)0x0) {
        (**(code **)(**(long **)((long)(p_Var2 + -4) + lVar4) + 8))();
      }
      *(undefined8 *)((long)(p_Var2 + -4) + lVar4) = 0;
      lVar4 = lVar4 + -0x50;
    } while (lVar4 != -0x280);
    p_Var2 = p_Var2 + -0x52;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

TracingTLS::~TracingTLS() {
  // Avoid entering trace points while the thread is being torn down.
  // This is the problem: when a thread exits, the at-thread-exit destroys the
  // TracingTLS. As part of that the various TraceWriter for the active data
  // sources are destroyd. A TraceWriter dtor will issue a PostTask on the IPC
  // thread to issue a final flush and unregister its ID with the service.
  // The PostTask, in chromium, might have a trace event that will try to
  // re-enter the tracing system.
  // We fix this by resetting the TLS key to the TracingTLS object that is
  // being destroyed in the platform impl (platform_posix.cc,
  // platform_windows.cc, chromium's platform.cc). We carefully rely on the fact
  // that all the tracing path that will be invoked during thread exit will
  // early out if |is_in_trace_point| == true and will not depend on the other
  // TLS state that has been destroyed.
  is_in_trace_point = true;
}